

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall FIX::HttpServer::onInitialize(HttpServer *this,SessionSettings *s)

{
  SocketServer *this_00;
  exception *anon_var_0;
  SessionSettings *s_local;
  HttpServer *this_local;
  
  this_00 = (SocketServer *)operator_new(0x160);
  SocketServer::SocketServer(this_00,1);
  this->m_pServer = this_00;
  SocketServer::add(this->m_pServer,this->m_port,true,false,0,0);
  return;
}

Assistant:

EXCEPT(RuntimeError) {
  try {
    m_pServer = new SocketServer(1);
    m_pServer->add(m_port, true, false, 0, 0);
  } catch (std::exception &) {
    throw RuntimeError("Unable to create, bind, or listen to port " + IntConvertor::convert((unsigned short)m_port));
  }
}